

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLogger.cpp
# Opt level: O2

string * __thiscall
SLogLib::MemoryLogger::Messages_abi_cxx11_(string *__return_storage_ptr__,MemoryLogger *this)

{
  MemoryLoggerPriv *pMVar1;
  mutex *__mutex;
  MemoryLoggerPriv *pMVar2;
  stringstream _stream;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  __mutex = &this->mPriv->mMessagesMutex;
  std::mutex::lock(__mutex);
  std::__cxx11::stringstream::stringstream(local_1b0);
  pMVar1 = this->mPriv;
  pMVar2 = pMVar1;
  while (pMVar2 = (MemoryLoggerPriv *)
                  (pMVar2->mMessages).
                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl._M_node.super__List_node_base._M_next, pMVar2 != pMVar1) {
    std::operator<<(local_1a0,
                    (string *)
                    &(pMVar2->mMessages).
                     super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl._M_node._M_size);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return __return_storage_ptr__;
}

Assistant:

std::string MemoryLogger::Messages() const
{
	std::lock_guard<std::mutex> _lock(mPriv->mMessagesMutex);
	
	std::stringstream _stream;
	for(const std::string& _message : mPriv->mMessages)
	{
		_stream << _message;
	}
	return _stream.str();
}